

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Vec_Int_t * Gia_ManDupTrimmedNonZero(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p_00;
  Gia_Man_t *p_01;
  Vec_Int_t *p_02;
  Gia_Obj_t *pObj_00;
  bool bVar4;
  int local_34;
  Gia_Obj_t *pGStack_30;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNonDual;
  Gia_Man_t *pTemp;
  Vec_Int_t *vNonZero;
  Gia_Man_t *p_local;
  
  uVar1 = Gia_ManPoNum(p);
  if ((uVar1 & 1) != 0) {
    __assert_fail("(Gia_ManPoNum(p) & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x851,"Vec_Int_t *Gia_ManDupTrimmedNonZero(Gia_Man_t *)");
  }
  p_00 = Gia_ManTransformMiter(p);
  p_01 = Gia_ManSeqStructSweep(p_00,1,1,0);
  Gia_ManStop(p_00);
  iVar2 = Gia_ManPiNum(p_01);
  if (0 < iVar2) {
    iVar2 = Gia_ManPoNum(p_01);
    iVar3 = Gia_ManPoNum(p);
    if (iVar2 << 1 == iVar3) {
      p_02 = Vec_IntAlloc(100);
      local_34 = 0;
      while( true ) {
        iVar2 = Gia_ManPoNum(p_01);
        bVar4 = false;
        if (local_34 < iVar2) {
          pGStack_30 = Gia_ManCo(p_01,local_34);
          bVar4 = pGStack_30 != (Gia_Obj_t *)0x0;
        }
        if (!bVar4) break;
        pObj_00 = Gia_ObjFanin0(pGStack_30);
        iVar2 = Gia_ObjIsConst0(pObj_00);
        if (iVar2 == 0) {
          Vec_IntPush(p_02,local_34);
        }
        local_34 = local_34 + 1;
      }
      Gia_ManStop(p_01);
      return p_02;
    }
    __assert_fail("2 * Gia_ManPoNum(pNonDual) == Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x856,"Vec_Int_t *Gia_ManDupTrimmedNonZero(Gia_Man_t *)");
  }
  __assert_fail("Gia_ManPiNum(pNonDual) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0x855,"Vec_Int_t *Gia_ManDupTrimmedNonZero(Gia_Man_t *)");
}

Assistant:

Vec_Int_t * Gia_ManDupTrimmedNonZero( Gia_Man_t * p )
{
    Vec_Int_t * vNonZero;
    Gia_Man_t * pTemp, * pNonDual;
    Gia_Obj_t * pObj;
    int i;
    assert( (Gia_ManPoNum(p) & 1) == 0 );
    pNonDual = Gia_ManTransformMiter( p );
    pNonDual = Gia_ManSeqStructSweep( pTemp = pNonDual, 1, 1, 0 );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNonDual) > 0 );
    assert( 2 * Gia_ManPoNum(pNonDual) == Gia_ManPoNum(p) );
    // skip PO pairs corresponding to const0 POs of the non-dual miter
    vNonZero = Vec_IntAlloc( 100 );
    Gia_ManForEachPo( pNonDual, pObj, i )
        if ( !Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
            Vec_IntPush( vNonZero, i );
    Gia_ManStop( pNonDual );
    return vNonZero;
}